

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  LodePNGState local_2b0;
  
  lodepng_state_init(&local_2b0);
  local_2b0.info_raw.bitdepth = bitdepth;
  local_2b0.info_png.color.bitdepth = bitdepth;
  local_2b0.info_raw.colortype = colortype;
  local_2b0.info_png.color.colortype = colortype;
  lodepng_encode(out,outsize,image,w,h,&local_2b0);
  lodepng_state_cleanup(&local_2b0);
  return local_2b0.error;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}